

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

int connection_set_remote_idle_timeout_empty_frame_send_ratio
              (CONNECTION_HANDLE connection,double idle_timeout_empty_frame_send_ratio)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (((1.0 < idle_timeout_empty_frame_send_ratio) || (connection == (CONNECTION_HANDLE)0x0)) ||
     (idle_timeout_empty_frame_send_ratio <= 0.0)) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x85a;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                ,"connection_set_remote_idle_timeout_empty_frame_send_ratio",0x859,1,
                "Bad arguments: connection = %p, idle_timeout_empty_frame_send_ratio = %f",
                idle_timeout_empty_frame_send_ratio,connection);
    }
  }
  else {
    connection->idle_timeout_empty_frame_send_ratio = idle_timeout_empty_frame_send_ratio;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int connection_set_remote_idle_timeout_empty_frame_send_ratio(CONNECTION_HANDLE connection, double idle_timeout_empty_frame_send_ratio)
{
    int result;

    if ((connection == NULL) ||
        (idle_timeout_empty_frame_send_ratio <= 0.0) ||
        (idle_timeout_empty_frame_send_ratio > 1.0))
    {
        LogError("Bad arguments: connection = %p, idle_timeout_empty_frame_send_ratio = %f",
            connection, idle_timeout_empty_frame_send_ratio);
        result = MU_FAILURE;
    }
    else
    {
        connection->idle_timeout_empty_frame_send_ratio = idle_timeout_empty_frame_send_ratio;
        result = 0;
    }

    return result;
}